

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_test.cpp
# Opt level: O0

string * conv(string *l,size_t i)

{
  ulong uVar1;
  char *pcVar2;
  ostream *this;
  void *this_00;
  ulong in_RDX;
  ulong in_RSI;
  string *in_RDI;
  ostringstream ss;
  ostringstream local_1a8 [379];
  allocator local_2d [20];
  allocator local_19 [9];
  ulong local_10;
  
  local_10 = in_RSI;
  uVar1 = std::__cxx11::string::size();
  if (in_RDX < uVar1) {
    pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
    if (*pcVar2 == '\n') {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(in_RDI,"\\n",local_2d);
      std::allocator<char>::~allocator((allocator<char> *)local_2d);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
      if (*pcVar2 < ' ') {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        this = std::operator<<((ostream *)local_1a8,"\\x");
        this_00 = (void *)std::ostream::operator<<(this,std::hex);
        pcVar2 = (char *)std::__cxx11::string::operator[](local_10);
        std::ostream::operator<<(this_00,(int)*pcVar2);
        std::__cxx11::ostringstream::str();
        std::__cxx11::ostringstream::~ostringstream(local_1a8);
      }
      else {
        std::__cxx11::string::substr((ulong)in_RDI,local_10);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"---",local_19);
    std::allocator<char>::~allocator((allocator<char> *)local_19);
  }
  return in_RDI;
}

Assistant:

std::string conv(std::string const &l,size_t i)
{
	if(i >= l.size()) {
		return "---";
	}
	if(l[i] == '\n')
		return "\\n";
	if(l[i] < 32) {
		std::ostringstream ss;
		ss <<"\\x" << std::hex << (int)(l[i]);
		return ss.str();
	}
	else {
		return l.substr(i,1);
	}
}